

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XMLReader.cpp
# Opt level: O3

bool __thiscall xercesc_4_0::XMLReader::skippedStringLong(XMLReader *this,XMLCh *toSkip)

{
  short *psVar1;
  bool bVar2;
  int iVar3;
  ulong uVar4;
  ulong uVar5;
  XMLSize_t XVar6;
  long lVar7;
  ulong uVar8;
  
  bVar2 = true;
  if (toSkip != (XMLCh *)0x0) {
    lVar7 = 0;
    do {
      psVar1 = (short *)((long)toSkip + lVar7);
      lVar7 = lVar7 + 2;
    } while (*psVar1 != 0);
    uVar8 = (lVar7 >> 1) - 1;
    if (uVar8 != 0) {
      XVar6 = this->fCharIndex;
      uVar4 = this->fCharsAvail - XVar6;
      do {
        uVar5 = uVar4;
        if (uVar4 != 0x4000 && uVar4 < uVar8) {
          do {
            bVar2 = refreshCharBuffer(this);
            if (!bVar2) {
              return false;
            }
            XVar6 = this->fCharIndex;
            uVar4 = this->fCharsAvail - XVar6;
            if (uVar4 == uVar5) {
              return false;
            }
          } while ((uVar4 < uVar8) && (uVar5 = uVar4, uVar4 != 0x4000));
        }
        uVar5 = uVar8;
        if (uVar4 < uVar8) {
          uVar5 = uVar4;
        }
        iVar3 = bcmp(this->fCharBuf + XVar6,toSkip,uVar5 * 2);
        bVar2 = iVar3 == 0;
        if (!bVar2) {
          return bVar2;
        }
        toSkip = toSkip + uVar5;
        XVar6 = XVar6 + uVar5;
        this->fCurCol = this->fCurCol + uVar5;
        uVar4 = uVar4 - uVar5;
        this->fCharIndex = XVar6;
        uVar8 = uVar8 - uVar5;
      } while (uVar8 != 0);
    }
  }
  return bVar2;
}

Assistant:

bool XMLReader::skippedStringLong(const XMLCh* toSkip)
{
    // This function works on strings that are potentially longer than
    // kCharBufSize (e.g., end tag). This function does not guarantee
    // that in case the comparison is unsuccessful the fCharIndex will
    // point to the original data.
    //

    XMLSize_t srcLen = XMLString::stringLen(toSkip);
    XMLSize_t charsLeft = charsLeftInBuffer();

    while (srcLen != 0)
    {
      // Fill up the buffer with as much data as possible.
      //
      while (charsLeft < srcLen && charsLeft != kCharBufSize)
      {
        if (!refreshCharBuffer())
          return false;

        XMLSize_t tmp = charsLeftInBuffer();
        if (tmp == charsLeft) // if the refreshCharBuf() did not add anything
          return false;       // new give up and return.

        charsLeft = tmp;
      }

      XMLSize_t n = charsLeft < srcLen ? charsLeft : srcLen;

      if (memcmp(&fCharBuf[fCharIndex], toSkip, n * sizeof(XMLCh)))
        return false;

      toSkip += n;
      srcLen -= n;

      fCharIndex += n;
      fCurCol += (XMLFileLoc)n;
      charsLeft -= n;
    }

    return true;
}